

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  char *pcVar2;
  char *begin;
  int n;
  char local_1b [3];
  
  iVar1 = tm_time->tm_hour;
  n = iVar1 + -0xc;
  if (iVar1 < 0xd) {
    n = iVar1;
  }
  fmt_helper::pad2(n,dest);
  local_1b[2] = 0x3a;
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,local_1b + 2);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_1b[1] = 0x3a;
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,local_1b + 1);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_1b[0] = ' ';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,local_1b);
  begin = "AM";
  if (0xb < tm_time->tm_hour) {
    begin = "PM";
  }
  pcVar2 = "AM";
  if (0xb < tm_time->tm_hour) {
    pcVar2 = "PM";
  }
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,begin,pcVar2 + 2);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }